

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::DiscMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  long lVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  Scene *pSVar22;
  undefined4 uVar23;
  undefined8 unaff_R12;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar28;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar39 [32];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar57 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_1d4;
  RayQueryContext *local_1d0;
  Scene *local_1c8;
  float local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  RTCFilterFunctionNArguments local_190;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0 [4];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  undefined1 auVar70 [64];
  
  pSVar22 = context->scene;
  pGVar3 = (pSVar22->geometries).items[Disc->sharedGeomID].ptr;
  lVar4 = *(long *)&pGVar3->field_0x58;
  _Var5 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar25._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[4] * _Var5);
  auVar25._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[0] * _Var5);
  auVar26._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[5] * _Var5);
  auVar26._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[1] * _Var5);
  auVar29._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[6] * _Var5);
  auVar29._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[2] * _Var5);
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[7] * _Var5);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[3] * _Var5);
  auVar64 = vunpcklps_avx(auVar25,auVar29);
  auVar29 = vunpckhps_avx(auVar25,auVar29);
  auVar17 = vunpcklps_avx(auVar26,auVar39);
  auVar39 = vunpckhps_avx(auVar26,auVar39);
  auVar25 = vunpcklps_avx(auVar64,auVar17);
  auVar64 = vunpckhps_avx(auVar64,auVar17);
  auVar17 = vunpcklps_avx(auVar29,auVar39);
  local_150 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_160 = local_150;
  uVar23 = *(undefined4 *)&(ray->org).field_0;
  auVar30._4_4_ = uVar23;
  auVar30._0_4_ = uVar23;
  auVar30._8_4_ = uVar23;
  auVar30._12_4_ = uVar23;
  auVar30._16_4_ = uVar23;
  auVar30._20_4_ = uVar23;
  auVar30._24_4_ = uVar23;
  auVar30._28_4_ = uVar23;
  auVar25 = vsubps_avx(auVar25,auVar30);
  uVar23 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar27._4_4_ = uVar23;
  auVar27._0_4_ = uVar23;
  auVar27._8_4_ = uVar23;
  auVar27._12_4_ = uVar23;
  auVar27._16_4_ = uVar23;
  auVar27._20_4_ = uVar23;
  auVar27._24_4_ = uVar23;
  auVar27._28_4_ = uVar23;
  uVar23 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar55._4_4_ = uVar23;
  auVar55._0_4_ = uVar23;
  auVar55._8_4_ = uVar23;
  auVar55._12_4_ = uVar23;
  auVar55._16_4_ = uVar23;
  auVar55._20_4_ = uVar23;
  auVar55._24_4_ = uVar23;
  auVar55._28_4_ = uVar23;
  auVar26 = vsubps_avx(auVar64,auVar27);
  auVar27 = vsubps_avx(auVar17,auVar55);
  fVar1 = (ray->dir).field_0.m128[0];
  uVar24 = *(ulong *)((long)&(ray->dir).field_0 + 4);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar24;
  auVar15 = vshufps_avx(auVar54,auVar54,0);
  aVar2 = (ray->dir).field_0;
  auVar54 = vshufps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0xee);
  fVar53 = (float)uVar24;
  fVar66 = (ray->dir).field_0.m128[0];
  auVar54 = ZEXT416((uint)(fVar66 * fVar66 + auVar54._0_4_ * auVar54._0_4_ + fVar53 * fVar53));
  auVar54 = vshufps_avx(auVar54,auVar54,0);
  auVar64._16_16_ = auVar54;
  auVar64._0_16_ = auVar54;
  auVar64 = vrcpps_avx(auVar64);
  auVar16 = vshufps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0xaa);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  fVar66 = auVar64._0_4_;
  fVar58 = auVar64._4_4_;
  auVar17._4_4_ = fVar58 * auVar54._4_4_;
  auVar17._0_4_ = fVar66 * auVar54._0_4_;
  fVar59 = auVar64._8_4_;
  auVar17._8_4_ = fVar59 * auVar54._8_4_;
  fVar60 = auVar64._12_4_;
  auVar17._12_4_ = fVar60 * auVar54._12_4_;
  fVar61 = auVar64._16_4_;
  auVar17._16_4_ = fVar61 * auVar54._0_4_;
  fVar62 = auVar64._20_4_;
  auVar17._20_4_ = fVar62 * auVar54._4_4_;
  fVar63 = auVar64._24_4_;
  auVar17._24_4_ = fVar63 * auVar54._8_4_;
  auVar17._28_4_ = auVar54._12_4_;
  auVar17 = vsubps_avx(auVar57,auVar17);
  fVar53 = auVar16._0_4_;
  fVar46 = auVar27._0_4_;
  fVar9 = auVar16._4_4_;
  fVar47 = auVar27._4_4_;
  fVar11 = auVar16._8_4_;
  fVar48 = auVar27._8_4_;
  fVar13 = auVar16._12_4_;
  fVar49 = auVar27._12_4_;
  fVar50 = auVar27._16_4_;
  fVar51 = auVar27._20_4_;
  fVar52 = auVar27._24_4_;
  fVar8 = auVar15._0_4_;
  fVar38 = auVar26._0_4_;
  fVar10 = auVar15._4_4_;
  fVar40 = auVar26._4_4_;
  fVar12 = auVar15._8_4_;
  fVar41 = auVar26._8_4_;
  fVar14 = auVar15._12_4_;
  fVar42 = auVar26._12_4_;
  fVar43 = auVar26._16_4_;
  fVar44 = auVar26._20_4_;
  fVar45 = auVar26._24_4_;
  fVar28 = auVar25._0_4_;
  fVar32 = auVar25._4_4_;
  fVar33 = auVar25._8_4_;
  fVar34 = auVar25._12_4_;
  fVar35 = auVar25._16_4_;
  fVar36 = auVar25._20_4_;
  fVar37 = auVar25._24_4_;
  fVar56 = (fVar28 * fVar1 + fVar38 * fVar8 + fVar46 * fVar53) * (fVar66 + fVar66 * auVar17._0_4_);
  fVar58 = (fVar32 * fVar1 + fVar40 * fVar10 + fVar47 * fVar9) * (fVar58 + fVar58 * auVar17._4_4_);
  local_e0._4_4_ = fVar58;
  local_e0._0_4_ = fVar56;
  fVar59 = (fVar33 * fVar1 + fVar41 * fVar12 + fVar48 * fVar11) * (fVar59 + fVar59 * auVar17._8_4_);
  local_e0._8_4_ = fVar59;
  fVar60 = (fVar34 * fVar1 + fVar42 * fVar14 + fVar49 * fVar13) * (fVar60 + fVar60 * auVar17._12_4_)
  ;
  local_e0._12_4_ = fVar60;
  fVar61 = (fVar35 * fVar1 + fVar43 * fVar8 + fVar50 * fVar53) * (fVar61 + fVar61 * auVar17._16_4_);
  local_e0._16_4_ = fVar61;
  fVar62 = (fVar36 * fVar1 + fVar44 * fVar10 + fVar51 * fVar9) * (fVar62 + fVar62 * auVar17._20_4_);
  local_e0._20_4_ = fVar62;
  fVar63 = (fVar37 * fVar1 + fVar45 * fVar12 + fVar52 * fVar11) * (fVar63 + fVar63 * auVar17._24_4_)
  ;
  local_e0._24_4_ = fVar63;
  local_e0._28_4_ = auVar64._28_4_ + auVar17._28_4_;
  uVar23 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar65._4_4_ = uVar23;
  auVar65._0_4_ = uVar23;
  auVar65._8_4_ = uVar23;
  auVar65._12_4_ = uVar23;
  auVar65._16_4_ = uVar23;
  auVar65._20_4_ = uVar23;
  auVar65._24_4_ = uVar23;
  auVar65._28_4_ = uVar23;
  auVar64 = vcmpps_avx(auVar65,local_e0,2);
  fVar66 = ray->tfar;
  auVar69._4_4_ = fVar66;
  auVar69._0_4_ = fVar66;
  auVar69._8_4_ = fVar66;
  auVar69._12_4_ = fVar66;
  auVar69._16_4_ = fVar66;
  auVar69._20_4_ = fVar66;
  auVar69._24_4_ = fVar66;
  auVar69._28_4_ = fVar66;
  auVar70 = ZEXT3264(auVar69);
  auVar17 = vcmpps_avx(local_e0,auVar69,2);
  auVar64 = vandps_avx(auVar64,auVar17);
  auVar54 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar67._16_16_ = auVar54;
  auVar67._0_16_ = auVar54;
  auVar17 = vcvtdq2ps_avx(auVar67);
  auVar17 = vcmpps_avx(_DAT_01f7b060,auVar17,1);
  auVar30 = auVar17 & auVar64;
  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar30 >> 0x7f,0) != '\0') ||
        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar30 >> 0xbf,0) != '\0') ||
      (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar30[0x1f] < '\0') {
    auVar64 = vandps_avx(auVar64,auVar17);
    auVar30 = vunpckhps_avx(auVar29,auVar39);
    auVar18._4_4_ = fVar58 * fVar1;
    auVar18._0_4_ = fVar56 * fVar1;
    auVar18._8_4_ = fVar59 * fVar1;
    auVar18._12_4_ = fVar60 * fVar1;
    auVar18._16_4_ = fVar61 * fVar1;
    auVar18._20_4_ = fVar62 * fVar1;
    auVar18._24_4_ = fVar63 * fVar1;
    auVar18._28_4_ = auVar39._28_4_;
    auVar19._4_4_ = fVar58 * fVar10;
    auVar19._0_4_ = fVar56 * fVar8;
    auVar19._8_4_ = fVar59 * fVar12;
    auVar19._12_4_ = fVar60 * fVar14;
    auVar19._16_4_ = fVar61 * fVar8;
    auVar19._20_4_ = fVar62 * fVar10;
    auVar19._24_4_ = fVar63 * fVar12;
    auVar19._28_4_ = auVar17._28_4_;
    auVar21._4_4_ = fVar58 * fVar9;
    auVar21._0_4_ = fVar56 * fVar53;
    auVar21._8_4_ = fVar59 * fVar11;
    auVar21._12_4_ = fVar60 * fVar13;
    auVar21._16_4_ = fVar61 * fVar53;
    auVar21._20_4_ = fVar62 * fVar9;
    auVar21._24_4_ = fVar63 * fVar11;
    auVar21._28_4_ = DAT_01f7b060._28_4_;
    auVar17 = vsubps_avx(auVar25,auVar18);
    auVar29 = vsubps_avx(auVar26,auVar19);
    auVar39 = vsubps_avx(auVar27,auVar21);
    auVar68._0_4_ =
         auVar29._0_4_ * auVar29._0_4_ + auVar39._0_4_ * auVar39._0_4_ +
         auVar17._0_4_ * auVar17._0_4_;
    auVar68._4_4_ =
         auVar29._4_4_ * auVar29._4_4_ + auVar39._4_4_ * auVar39._4_4_ +
         auVar17._4_4_ * auVar17._4_4_;
    auVar68._8_4_ =
         auVar29._8_4_ * auVar29._8_4_ + auVar39._8_4_ * auVar39._8_4_ +
         auVar17._8_4_ * auVar17._8_4_;
    auVar68._12_4_ =
         auVar29._12_4_ * auVar29._12_4_ + auVar39._12_4_ * auVar39._12_4_ +
         auVar17._12_4_ * auVar17._12_4_;
    auVar68._16_4_ =
         auVar29._16_4_ * auVar29._16_4_ + auVar39._16_4_ * auVar39._16_4_ +
         auVar17._16_4_ * auVar17._16_4_;
    auVar68._20_4_ =
         auVar29._20_4_ * auVar29._20_4_ + auVar39._20_4_ * auVar39._20_4_ +
         auVar17._20_4_ * auVar17._20_4_;
    auVar68._24_4_ =
         auVar29._24_4_ * auVar29._24_4_ + auVar39._24_4_ * auVar39._24_4_ +
         auVar17._24_4_ * auVar17._24_4_;
    auVar68._28_4_ = auVar29._28_4_ + auVar39._28_4_ + auVar17._28_4_;
    auVar20._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar20._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar20._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar20._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar20._16_4_ = auVar30._16_4_ * auVar30._16_4_;
    auVar20._20_4_ = auVar30._20_4_ * auVar30._20_4_;
    auVar20._24_4_ = auVar30._24_4_ * auVar30._24_4_;
    auVar20._28_4_ = auVar17._28_4_;
    auVar17 = vcmpps_avx(auVar68,auVar20,2);
    auVar29 = auVar64 & auVar17;
    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0x7f,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar29 >> 0xbf,0) != '\0') ||
        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0')
    {
      auVar64 = vandps_avx(auVar64,auVar17);
      auVar31._0_4_ = fVar28 * fVar28 + fVar38 * fVar38 + fVar46 * fVar46;
      auVar31._4_4_ = fVar32 * fVar32 + fVar40 * fVar40 + fVar47 * fVar47;
      auVar31._8_4_ = fVar33 * fVar33 + fVar41 * fVar41 + fVar48 * fVar48;
      auVar31._12_4_ = fVar34 * fVar34 + fVar42 * fVar42 + fVar49 * fVar49;
      auVar31._16_4_ = fVar35 * fVar35 + fVar43 * fVar43 + fVar50 * fVar50;
      auVar31._20_4_ = fVar36 * fVar36 + fVar44 * fVar44 + fVar51 * fVar51;
      auVar31._24_4_ = fVar37 * fVar37 + fVar45 * fVar45 + fVar52 * fVar52;
      auVar31._28_4_ = auVar25._28_4_ + auVar26._28_4_ + auVar27._28_4_;
      auVar17 = vcmpps_avx(auVar31,auVar20,6);
      auVar25 = auVar64 & auVar17;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar64 = vandps_avx(auVar17,auVar64);
        local_a0._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
        local_a0._8_4_ = -fVar12;
        local_a0._12_4_ = -fVar14;
        local_a0._16_4_ = -fVar8;
        local_a0._20_4_ = -fVar10;
        local_a0._24_4_ = -fVar12;
        local_a0._28_4_ = -fVar14;
        local_80[0]._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
        local_80[0]._8_4_ = -fVar11;
        local_80[0]._12_4_ = -fVar13;
        local_80[0]._16_4_ = -fVar53;
        local_80[0]._20_4_ = -fVar9;
        local_80[0]._24_4_ = -fVar11;
        local_80[0]._28_4_ = -fVar13;
        local_100 = ZEXT832(0) << 0x20;
        local_120 = ZEXT832(0) << 0x20;
        local_c0[0] = -fVar1;
        local_c0[1] = -fVar1;
        local_c0[2] = -fVar1;
        local_c0[3] = -fVar1;
        fStack_b0 = -fVar1;
        fStack_ac = -fVar1;
        fStack_a8 = -fVar1;
        fStack_a4 = -fVar1;
        uVar23 = vmovmskps_avx(auVar64);
        uVar24 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar23);
        local_1d0 = context;
        local_1c8 = pSVar22;
        do {
          local_190.hit = (RTCHitN *)&local_1c0;
          local_190.valid = &local_1d4;
          uVar7 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          local_1a8 = *(uint *)(local_160 + uVar7 * 4);
          pGVar3 = (pSVar22->geometries).items[local_1a8].ptr;
          if ((pGVar3->mask & ray->mask) != 0) {
            if ((local_1d0->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            local_140 = auVar70._0_32_;
            local_1b4 = *(undefined4 *)(local_120 + uVar7 * 4);
            local_1b0 = *(undefined4 *)(local_100 + uVar7 * 4);
            local_1ac = (Disc->primIDs).field_0.i[uVar7];
            local_1c0 = local_c0[uVar7];
            local_1bc = *(undefined4 *)(local_a0 + uVar7 * 4);
            local_1b8 = *(undefined4 *)(local_80[0] + uVar7 * 4);
            local_1a4 = local_1d0->user->instID[0];
            local_1a0 = local_1d0->user->instPrimID[0];
            ray->tfar = local_c0[uVar7 - 8];
            local_1d4 = -1;
            local_190.geometryUserPtr = pGVar3->userPtr;
            local_190.context = local_1d0->user;
            local_190.N = 1;
            local_190.ray = (RTCRayN *)ray;
            if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar3->occlusionFilterN)(&local_190), *local_190.valid != 0)) {
              p_Var6 = local_1d0->args->filter;
              if ((p_Var6 == (RTCFilterFunctionN)0x0) ||
                 ((((local_1d0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                    RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar3->field_8).field_0x2 & 0x40) == 0)) ||
                  ((*p_Var6)(&local_190), *local_190.valid != 0)))) {
                return true;
              }
            }
            auVar70 = ZEXT3264(local_140);
            ray->tfar = local_140._0_4_;
            pSVar22 = local_1c8;
          }
          uVar24 = uVar24 ^ 1L << (uVar7 & 0x3f);
        } while (uVar24 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }